

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

Expression_node * __thiscall
lossless_neural_sound::expression_compiler::expression::Product::get_derivative_implementation
          (Product *this,Arena *arena,Nodes *nodes,Variable *variable)

{
  int iVar1;
  _Map_base<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *ppEVar2;
  undefined4 extraout_var;
  Expression_node *pEVar4;
  ulong uVar5;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  factors;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  terms;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  current_factors;
  Expression_node *local_a0;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  local_98;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  local_78;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  local_58;
  Expression_node *local_40;
  Expression_node *local_38;
  mapped_type pEVar3;
  
  local_98.
  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = &variable->super_Expression_node;
  Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
  visit_leaves<lossless_neural_sound::expression_compiler::expression::Product::get_derivative_implementation(lossless_neural_sound::expression_compiler::Arena&,lossless_neural_sound::expression_compiler::expression::Nodes&,lossless_neural_sound::expression_compiler::expression::Variable_const*)const::_lambda(lossless_neural_sound::expression_compiler::expression::Expression_node_const*)_1_>
            (&this->
              super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>,
             &local_98);
  local_78.
  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (Expression_node **)0x0;
  local_78.
  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Expression_node **)0x0;
  local_78.
  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Expression_node **)0x0;
  std::
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ::reserve(&local_78,
            (long)local_98.
                  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_98.
                  super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ::vector(&local_58,&local_98);
  if (local_98.
      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_98.
      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      pEVar4 = local_98.
               super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5];
      local_a0 = local_40;
      local_38 = pEVar4;
      this_00 = (_Map_base<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)std::__detail::
                   _Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_std::unordered_map<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&nodes->derivative_cache,&local_38);
      ppEVar2 = std::__detail::
                _Map_base<const_lossless_neural_sound::expression_compiler::expression::Variable_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Variable_*const,_const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Variable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](this_00,(key_type *)&local_a0);
      pEVar3 = *ppEVar2;
      if (pEVar3 == (mapped_type)0x0) {
        iVar1 = (*(pEVar4->super_Node)._vptr_Node[10])(pEVar4,arena,nodes,local_a0);
        pEVar3 = (mapped_type)CONCAT44(extraout_var,iVar1);
        *ppEVar2 = pEVar3;
      }
      local_58.
      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5] = pEVar3;
      local_a0 = make(arena,nodes,
                      local_58.
                      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.
                            super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
      if (local_78.
          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_78.
          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<lossless_neural_sound::expression_compiler::expression::Expression_node_const*,std::allocator<lossless_neural_sound::expression_compiler::expression::Expression_node_const*>>
        ::
        _M_realloc_insert<lossless_neural_sound::expression_compiler::expression::Expression_node_const*>
                  ((vector<lossless_neural_sound::expression_compiler::expression::Expression_node_const*,std::allocator<lossless_neural_sound::expression_compiler::expression::Expression_node_const*>>
                    *)&local_78,
                   (iterator)
                   local_78.
                   super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
      }
      else {
        *local_78.
         super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_a0;
        local_78.
        super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_78.
             super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_58.
      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5] =
           local_98.
           super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_98.
                                   super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_98.
                                   super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pEVar4 = Sum::make(arena,nodes,
                     local_78.
                     super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (long)local_78.
                           super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_78.
                           super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (local_58.
      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Expression_node **)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.
      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Expression_node **)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.
      super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pEVar4;
}

Assistant:

virtual const Expression_node *get_derivative_implementation(
        Arena &arena, Nodes &nodes, const Variable *variable) const override
    {
        std::vector<const Expression_node *> factors;
        visit_leaves([&](const Expression_node *factor)
                     {
                         factors.push_back(factor);
                     });
        std::vector<const Expression_node *> terms;
        terms.reserve(factors.size());
        auto current_factors = factors;
        for(std::size_t i = 0; i < factors.size(); i++)
        {
            current_factors[i] = factors[i]->get_derivative(arena, nodes, variable);
            terms.push_back(make(arena, nodes, current_factors.data(), current_factors.size()));
            current_factors[i] = factors[i];
        }
        return Sum::make(arena, nodes, terms.data(), terms.size());
    }